

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_vm.hpp
# Opt level: O0

void __thiscall squall::VM::VM(VM *this,int stack_size)

{
  HSQUIRRELVM v;
  TableBase *this_00;
  SQInteger in_stack_ffffffffffffff98;
  unique_ptr<squall::TableBase,_std::default_delete<squall::TableBase>_> *this_01;
  HSQUIRRELVM in_stack_ffffffffffffffa0;
  HSQUIRRELVM vm;
  int stack_size_local;
  VM *this_local;
  
  detail::VMImp::VMImp(&this->imp_,stack_size);
  KlassTable::KlassTable(&this->klass_table_);
  std::unique_ptr<squall::TableBase,std::default_delete<squall::TableBase>>::
  unique_ptr<std::default_delete<squall::TableBase>,void>
            ((unique_ptr<squall::TableBase,std::default_delete<squall::TableBase>> *)
             &this->root_table_);
  v = handle(this);
  sq_setforeignptr(v,&this->klass_table_);
  sq_pushroottable((HSQUIRRELVM)0x1071cb);
  sq_getstackobj(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(HSQOBJECT *)0x1071e5);
  sq_pop(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_01 = &this->root_table_;
  this_00 = (TableBase *)operator_new(0x20);
  TableBase::TableBase(this_00,v,&this->root_);
  std::unique_ptr<squall::TableBase,_std::default_delete<squall::TableBase>_>::reset
            (this_01,this_00);
  return;
}

Assistant:

VM(int stack_size = 1024) : imp_(stack_size) {
        HSQUIRRELVM vm = handle();
        sq_setforeignptr(vm, &klass_table_);

        // root table取得 
        sq_pushroottable(vm);
        sq_getstackobj(vm, -1, &root_);
        sq_pop(vm, -1);

        root_table_.reset(new TableBase(vm, root_));
    }